

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O3

array<Centaurus::CharClass<char>,_3UL> * __thiscall
Centaurus::CharClass<char>::diff_and_int
          (array<Centaurus::CharClass<char>,_3UL> *__return_storage_ptr__,CharClass<char> *this,
          CharClass<char> *cc)

{
  pointer pRVar1;
  pointer pRVar2;
  pointer pRVar3;
  long lVar4;
  pointer pRVar5;
  pointer pRVar6;
  Range<char> rj;
  Range<char> ri;
  Range<char> local_68;
  Range<char> local_58;
  Range<char> local_48;
  CharClass<char> *local_38;
  
  lVar4 = 0;
  do {
    CharClass((CharClass<char> *)
              ((long)&__return_storage_ptr__->_M_elems[0]._vptr_CharClass + lVar4));
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x60);
  pRVar3 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar6 = (cc->m_ranges).
           super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_48._vptr_Range = (_func_int **)&PTR__Range_0019bf98;
  local_58._vptr_Range = (_func_int **)&PTR__Range_0019bf98;
  local_48.m_start = '\0';
  local_48.m_end = '\0';
  local_58.m_start = '\0';
  local_58.m_end = '\0';
  pRVar1 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pRVar3 != pRVar1) {
    local_48.m_start = pRVar3->m_start;
    local_48.m_end = pRVar3->m_end;
  }
  pRVar2 = (cc->m_ranges).
           super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pRVar6 != pRVar2) {
    local_58.m_start = pRVar6->m_start;
    local_58.m_end = pRVar6->m_end;
  }
  if (pRVar6 != pRVar2 && pRVar3 != pRVar1) {
    local_38 = __return_storage_ptr__->_M_elems + 2;
    pRVar5 = pRVar6;
    do {
      pRVar6 = pRVar5;
      if ((byte)local_58.m_start < (byte)local_48.m_end) {
        if ((byte)local_48.m_start < (byte)local_58.m_end) {
          if ((byte)local_48.m_start < (byte)local_58.m_start) {
            local_68._vptr_Range = (_func_int **)&PTR__Range_0019bf98;
            local_68.m_start = local_48.m_start;
            local_68.m_end = local_58.m_start;
            append(__return_storage_ptr__->_M_elems,&local_68);
            local_48.m_start = local_58.m_start;
          }
          else {
            if ((byte)local_48.m_start <= (byte)local_58.m_start) {
              if ((byte)local_48.m_end <= (byte)local_58.m_end) {
                if ((byte)local_48.m_end < (byte)local_58.m_end) {
                  local_68._vptr_Range = (_func_int **)&PTR__Range_0019bf98;
                  local_68.m_start = local_48.m_start;
                  local_68.m_end = local_48.m_end;
                  append(local_38,&local_68);
                  local_58.m_start = local_48.m_end;
                  goto LAB_0011d5c9;
                }
                local_68._vptr_Range = (_func_int **)&PTR__Range_0019bf98;
                local_68.m_start = local_48.m_start;
                local_68.m_end = local_58.m_end;
                append(local_38,&local_68);
                if (pRVar3 + 1 !=
                    (this->m_ranges).
                    super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  local_48.m_start = pRVar3[1].m_start;
                  local_48.m_end = pRVar3[1].m_end;
                }
                pRVar6 = pRVar5 + 1;
                if (pRVar6 != (cc->m_ranges).
                              super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish) {
                  local_58.m_start = pRVar5[1].m_start;
                  local_58.m_end = pRVar5[1].m_end;
                }
                goto LAB_0011d5dc;
              }
              local_68._vptr_Range = (_func_int **)&PTR__Range_0019bf98;
              local_68.m_start = local_58.m_start;
              local_68.m_end = local_58.m_end;
              append(local_38,&local_68);
              local_48.m_start = local_58.m_end;
              goto LAB_0011d5ee;
            }
            local_68._vptr_Range = (_func_int **)&PTR__Range_0019bf98;
            local_68.m_start = local_58.m_start;
            local_68.m_end = local_48.m_start;
            append(__return_storage_ptr__->_M_elems + 1,&local_68);
            local_58.m_start = local_48.m_start;
          }
        }
        else {
          append(__return_storage_ptr__->_M_elems + 1,&local_58);
LAB_0011d5ee:
          pRVar6 = pRVar5 + 1;
          if (pRVar6 != (cc->m_ranges).
                        super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
            local_58.m_start = pRVar5[1].m_start;
            local_58.m_end = pRVar5[1].m_end;
          }
        }
      }
      else {
        append(__return_storage_ptr__->_M_elems,&local_48);
LAB_0011d5c9:
        if (pRVar3 + 1 !=
            (this->m_ranges).
            super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_48.m_start = pRVar3[1].m_start;
          local_48.m_end = pRVar3[1].m_end;
        }
LAB_0011d5dc:
        pRVar3 = pRVar3 + 1;
      }
      pRVar1 = (this->m_ranges).
               super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pRVar2 = (cc->m_ranges).
               super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    } while ((pRVar3 != pRVar1) && (pRVar5 = pRVar6, pRVar6 != pRVar2));
  }
  if (pRVar3 != pRVar1) {
    while( true ) {
      append(__return_storage_ptr__->_M_elems,&local_48);
      if (pRVar3 + 1 ==
          (this->m_ranges).
          super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) break;
      local_48.m_start = pRVar3[1].m_start;
      local_48.m_end = pRVar3[1].m_end;
      pRVar3 = pRVar3 + 1;
    }
    pRVar2 = (cc->m_ranges).
             super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  if (pRVar6 != pRVar2) {
    while( true ) {
      append(__return_storage_ptr__->_M_elems + 1,&local_58);
      if (pRVar6 + 1 ==
          (cc->m_ranges).
          super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) break;
      local_58.m_start = pRVar6[1].m_start;
      local_58.m_end = pRVar6[1].m_end;
      pRVar6 = pRVar6 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<CharClass<TCHAR>, 3> diff_and_int(const CharClass<TCHAR>& cc) const
    {
        //Returns 3 character classes
        //ret[0] => *this & ~cc
        //ret[1] => ~(*this) & cc
        //ret[2] => *this & cc
        std::array<CharClass<TCHAR>, 3> ret;

        auto i = m_ranges.cbegin();
        auto j = cc.m_ranges.cbegin();
        
        Range<TCHAR> ri, rj;

        if (i != m_ranges.cend())
            ri = *i;
        if (j != cc.m_ranges.cend())
            rj = *j;

        while (i != m_ranges.cend() && j != cc.m_ranges.cend())
        {
            if (ri < rj)
            {
                ret[0].append(ri);
                if (++i != m_ranges.cend())
                    ri = *i;
            }
            else if (ri > rj)
            {
                ret[1].append(rj);
                if (++j != cc.m_ranges.cend())
                    rj = *j;
            }
            else
            {
                if (ri.start() < rj.start())
                {
                    //When ri begins earlier than rj
                    ret[0].append(Range<TCHAR>(ri.start(), rj.start()));
                    ri.start(rj.start());
                }
                else if (rj.start() < ri.start())
                {
                    //When rj begins earlier than ri
                    ret[1].append(Range<TCHAR>(rj.start(), ri.start()));
                    rj.start(ri.start());
                }
                else
                {
                    //ri.start() == rj.start()
                    if (ri.end() > rj.end())
                    {
                        //When ri ends later than rj
                        ret[2].append(Range<TCHAR>(rj.start(), rj.end()));
                        ri.start(rj.end());
                        if (++j != cc.m_ranges.cend())
                            rj = *j;
                    }
                    else if (ri.end() < rj.end())
                    {
                        //When rj ends later than ri
                        ret[2].append(Range<TCHAR>(ri.start(), ri.end()));
                        rj.start(ri.end());
                        if (++i != m_ranges.cend())
                            ri = *i;
                    }
                    else
                    {
                        //When ri equals to rj
                        ret[2].append(Range<TCHAR>(ri.start(), rj.end()));
                        if (++i != m_ranges.cend())
                            ri = *i;
                        if (++j != cc.m_ranges.cend())
                            rj = *j;
                    }
                }
            }
        }

        while (i != m_ranges.cend())
        {
            ret[0].append(ri);
            if (++i != m_ranges.cend())
                ri = *i;
        }
        while (j != cc.m_ranges.cend())
        {
            ret[1].append(rj);
            if (++j != cc.m_ranges.cend())
                rj = *j;
        }

        /*std::cout << ret[0] << std::endl;
        std::cout << ret[1] << std::endl;
        std::cout << ret[2] << std::endl;*/

        return ret;
    }